

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableDrawContextMenu(ImGuiTable *table)

{
  bool bVar1;
  char cVar2;
  char **ppcVar3;
  ImGuiTableColumn *pIVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  char *label;
  long lVar9;
  int iVar10;
  long lVar11;
  bool enabled;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    iVar6 = (int)table->ContextPopupColumn;
    iVar10 = -1;
    if ((iVar6 < 0) || (table->ColumnsCount <= iVar6)) {
      pIVar4 = (ImGuiTableColumn *)0x0;
    }
    else {
      pIVar4 = (table->Columns).Data + iVar6;
      iVar10 = iVar6;
    }
    uVar8 = table->Flags & 1;
    cVar2 = (char)uVar8;
    if (uVar8 != 0) {
      if (pIVar4 != (ImGuiTableColumn *)0x0) {
        if ((pIVar4->Flags & 0x20) == 0) {
          bVar1 = pIVar4->IsEnabled;
        }
        else {
          bVar1 = false;
        }
        pcVar5 = "*Missing Text*";
        if (GImGui->LocalizationTable[0] != (char *)0x0) {
          pcVar5 = GImGui->LocalizationTable[0];
        }
        bVar1 = MenuItem(pcVar5,(char *)0x0,false,bVar1);
        if (bVar1) {
          pIVar4 = (table->Columns).Data;
          if (pIVar4[iVar10].IsEnabled == true) {
            pIVar4[iVar10].CannotSkipItemsQueue = '\x01';
            table->AutoFitSingleColumn = (ImGuiTableColumnIdx)iVar10;
          }
        }
      }
      if ((table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount) &&
         ((table->Flags & 0xe000U) != 0x4000)) {
        ppcVar3 = GImGui->LocalizationTable + 1;
      }
      else {
        ppcVar3 = GImGui->LocalizationTable + 2;
      }
      pcVar5 = "*Missing Text*";
      if (*ppcVar3 != (char *)0x0) {
        pcVar5 = *ppcVar3;
      }
      bVar1 = MenuItem(pcVar5,(char *)0x0,false,true);
      if (bVar1) {
        TableSetColumnWidthAutoAll(table);
      }
    }
    if ((table->Flags & 2) != 0) {
      pcVar5 = "*Missing Text*";
      if (GImGui->LocalizationTable[3] != (char *)0x0) {
        pcVar5 = GImGui->LocalizationTable[3];
      }
      bVar1 = MenuItem(pcVar5,(char *)0x0,false,(bool)(table->IsDefaultDisplayOrder ^ 1));
      cVar2 = '\x01';
      if (bVar1) {
        table->IsResetDisplayOrderRequest = true;
      }
    }
    if ((table->Flags & 4) != 0) {
      if (cVar2 != '\0') {
        Separator();
      }
      PushItemFlag(0x20,true);
      if (0 < table->ColumnsCount) {
        lVar9 = 0x5c;
        lVar11 = 0;
        do {
          pIVar4 = (table->Columns).Data;
          uVar8 = *(uint *)((long)pIVar4 + lVar9 + -0x5c);
          cVar2 = (char)uVar8;
          if ((uVar8 & 1) == 0) {
            if ((table->IsLayoutLocked == false) && (pcVar5 = "", table->DeclColumnsCount <= lVar11)
               ) {
LAB_00231120:
              label = "<Unknown>";
              if (*pcVar5 != '\0') {
                label = pcVar5;
              }
            }
            else {
              lVar7 = (long)*(short *)((long)pIVar4 + lVar9 + -0xc);
              pcVar5 = "";
              if (lVar7 == -1) goto LAB_00231120;
              pcVar5 = (table->ColumnsNames).Buf.Data;
              label = "<Unknown>";
              if (pcVar5 != (char *)0x0) {
                pcVar5 = pcVar5 + lVar7;
                goto LAB_00231120;
              }
            }
            enabled = -1 < cVar2;
            bVar1 = *(bool *)((long)pIVar4 + lVar9 + -1);
            if (bVar1 == true) {
              enabled = '\x01' < table->ColumnsEnabledCount && -1 < cVar2;
            }
            bVar1 = MenuItem(label,(char *)0x0,bVar1,enabled);
            if (bVar1) {
              *(byte *)((long)&pIVar4->Flags + lVar9) = *(byte *)((long)pIVar4 + lVar9 + -1) ^ 1;
            }
          }
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 0x68;
        } while (lVar11 < table->ColumnsCount);
      }
      PopItemFlag();
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableDrawContextMenu(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    bool want_separator = false;
    const int column_n = (table->ContextPopupColumn >= 0 && table->ContextPopupColumn < table->ColumnsCount) ? table->ContextPopupColumn : -1;
    ImGuiTableColumn* column = (column_n != -1) ? &table->Columns[column_n] : NULL;

    // Sizing
    if (table->Flags & ImGuiTableFlags_Resizable)
    {
        if (column != NULL)
        {
            const bool can_resize = !(column->Flags & ImGuiTableColumnFlags_NoResize) && column->IsEnabled;
            if (MenuItem(LocalizeGetMsg(ImGuiLocKey_TableSizeOne), NULL, false, can_resize)) // "###SizeOne"
                TableSetColumnWidthAutoSingle(table, column_n);
        }

        const char* size_all_desc;
        if (table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount && (table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame)
            size_all_desc = LocalizeGetMsg(ImGuiLocKey_TableSizeAllFit);        // "###SizeAll" All fixed
        else
            size_all_desc = LocalizeGetMsg(ImGuiLocKey_TableSizeAllDefault);    // "###SizeAll" All stretch or mixed
        if (MenuItem(size_all_desc, NULL))
            TableSetColumnWidthAutoAll(table);
        want_separator = true;
    }

    // Ordering
    if (table->Flags & ImGuiTableFlags_Reorderable)
    {
        if (MenuItem(LocalizeGetMsg(ImGuiLocKey_TableResetOrder), NULL, false, !table->IsDefaultDisplayOrder))
            table->IsResetDisplayOrderRequest = true;
        want_separator = true;
    }

    // Reset all (should work but seems unnecessary/noisy to expose?)
    //if (MenuItem("Reset all"))
    //    table->IsResetAllRequest = true;

    // Sorting
    // (modify TableOpenContextMenu() to add _Sortable flag if enabling this)
#if 0
    if ((table->Flags & ImGuiTableFlags_Sortable) && column != NULL && (column->Flags & ImGuiTableColumnFlags_NoSort) == 0)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        bool append_to_sort_specs = g.IO.KeyShift;
        if (MenuItem("Sort in Ascending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Ascending, (column->Flags & ImGuiTableColumnFlags_NoSortAscending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Ascending, append_to_sort_specs);
        if (MenuItem("Sort in Descending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Descending, (column->Flags & ImGuiTableColumnFlags_NoSortDescending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Descending, append_to_sort_specs);
    }
#endif

    // Hiding / Visibility
    if (table->Flags & ImGuiTableFlags_Hideable)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        PushItemFlag(ImGuiItemFlags_SelectableDontClosePopup, true);
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
        {
            ImGuiTableColumn* other_column = &table->Columns[other_column_n];
            if (other_column->Flags & ImGuiTableColumnFlags_Disabled)
                continue;

            const char* name = TableGetColumnName(table, other_column_n);
            if (name == NULL || name[0] == 0)
                name = "<Unknown>";

            // Make sure we can't hide the last active column
            bool menu_item_active = (other_column->Flags & ImGuiTableColumnFlags_NoHide) ? false : true;
            if (other_column->IsUserEnabled && table->ColumnsEnabledCount <= 1)
                menu_item_active = false;
            if (MenuItem(name, NULL, other_column->IsUserEnabled, menu_item_active))
                other_column->IsUserEnabledNextFrame = !other_column->IsUserEnabled;
        }
        PopItemFlag();
    }
}